

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

tuple<mjs::token_type,_int> mjs::anon_unknown_2::get_punctuation(wstring_view s,version v)

{
  int iVar1;
  undefined4 uVar2;
  ostream *poVar3;
  runtime_error *this;
  int in_ECX;
  undefined4 uVar4;
  undefined4 in_register_00000014;
  wstring_view *s_00;
  _Tuple_impl<0UL,_mjs::token_type,_int> _Var5;
  wstring qs;
  ostringstream oss;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_1e8;
  wchar_t *local_1d8;
  wchar_t *local_1d0;
  long local_1c8 [2];
  wstring local_1b8;
  ostringstream local_198 [376];
  
  local_1e8._M_str = (wchar_t *)CONCAT44(in_register_00000014,v);
  local_1e8._M_len = (size_t)s._M_str;
  _Var5 = (_Tuple_impl<0UL,_mjs::token_type,_int>)s._M_len;
  if ((wchar_t *)local_1e8._M_len == (wchar_t *)0x0) {
    __assert_fail("!s.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x7c,
                  "std::tuple<token_type, int> mjs::(anonymous namespace)::get_punctuation(std::wstring_view, version)"
                 );
  }
  if (-1 < in_ECX) {
    if ((wchar_t *)0x3 < local_1e8._M_len) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,4,L">>>=");
      if (iVar1 == 0) {
        uVar2 = 5;
        uVar4 = 4;
        goto LAB_001707f8;
      }
    }
    if (local_1e8._M_len < (wchar_t *)0x3) {
LAB_0017006d:
      if ((wchar_t *)0x2 < local_1e8._M_len) {
        iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                          (&local_1e8,0,3,L"<<=");
        if (iVar1 == 0) {
          uVar2 = 7;
          goto LAB_0017077b;
        }
      }
      if ((wchar_t *)0x2 < local_1e8._M_len) {
        iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                          (&local_1e8,0,3,L">>=");
        if (iVar1 == 0) {
          uVar2 = 8;
          goto LAB_0017077b;
        }
      }
      goto LAB_001700b7;
    }
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,3,L">>>");
    if (iVar1 != 0) goto LAB_0017006d;
    uVar2 = 6;
LAB_0017077b:
    uVar4 = 3;
    goto LAB_001707f8;
  }
LAB_001700b7:
  if (0 < in_ECX) {
    if ((wchar_t *)0x2 < local_1e8._M_len) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,3,L"===");
      if (iVar1 == 0) {
        uVar2 = 9;
        goto LAB_0017077b;
      }
    }
    if ((wchar_t *)0x2 < local_1e8._M_len) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,3,L"!==");
      if (iVar1 == 0) {
        uVar2 = 10;
        goto LAB_0017077b;
      }
    }
  }
  if (in_ECX < 0) goto LAB_001708d8;
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"==");
    if (iVar1 != 0) goto LAB_00170132;
    uVar2 = 0xb;
LAB_001707f3:
    uVar4 = 2;
    goto LAB_001707f8;
  }
LAB_00170132:
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"!=");
    if (iVar1 == 0) {
      uVar2 = 0xc;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"<=");
    if (iVar1 == 0) {
      uVar2 = 0xd;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L">=");
    if (iVar1 == 0) {
      uVar2 = 0xe;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"&&");
    if (iVar1 == 0) {
      uVar2 = 0xf;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"||");
    if (iVar1 == 0) {
      uVar2 = 0x10;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"++");
    if (iVar1 == 0) {
      uVar2 = 0x11;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"--");
    if (iVar1 == 0) {
      uVar2 = 0x12;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"<<");
    if (iVar1 == 0) {
      uVar2 = 0x13;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L">>");
    if (iVar1 == 0) {
      uVar2 = 0x14;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"+=");
    if (iVar1 == 0) {
      uVar2 = 0x15;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"-=");
    if (iVar1 == 0) {
      uVar2 = 0x16;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"*=");
    if (iVar1 == 0) {
      uVar2 = 0x17;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"/=");
    if (iVar1 == 0) {
      uVar2 = 0x18;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"&=");
    if (iVar1 == 0) {
      uVar2 = 0x19;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"|=");
    if (iVar1 == 0) {
      uVar2 = 0x1a;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"^=");
    if (iVar1 == 0) {
      uVar2 = 0x1b;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)0x1 < local_1e8._M_len) {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,2,L"%=");
    if (iVar1 == 0) {
      uVar2 = 0x1c;
      goto LAB_001707f3;
    }
  }
  if ((wchar_t *)local_1e8._M_len == (wchar_t *)0x0) {
LAB_001703cc:
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L">");
      if (iVar1 == 0) {
        uVar2 = 0x1e;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"<");
      if (iVar1 == 0) {
        uVar2 = 0x1f;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L",");
      if (iVar1 == 0) {
        uVar2 = 0x20;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"!");
      if (iVar1 == 0) {
        uVar2 = 0x21;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"~");
      if (iVar1 == 0) {
        uVar2 = 0x22;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"?");
      if (iVar1 == 0) {
        uVar2 = 0x23;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L":");
      if (iVar1 == 0) {
        uVar2 = 0x24;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L".");
      if (iVar1 == 0) {
        uVar2 = 0x25;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"+");
      if (iVar1 == 0) {
        uVar2 = 0x26;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"-");
      if (iVar1 == 0) {
        uVar2 = 0x27;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"*");
      if (iVar1 == 0) {
        uVar2 = 0x28;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"/");
      if (iVar1 == 0) {
        uVar2 = 0x29;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"&");
      if (iVar1 == 0) {
        uVar2 = 0x2a;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"|");
      if (iVar1 == 0) {
        uVar2 = 0x2b;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"^");
      if (iVar1 == 0) {
        uVar2 = 0x2c;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"%");
      if (iVar1 == 0) {
        uVar2 = 0x2d;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"(");
      if (iVar1 == 0) {
        uVar2 = 0x2e;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L")");
      if (iVar1 == 0) {
        uVar2 = 0x2f;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"{");
      if (iVar1 == 0) {
        uVar2 = 0x30;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"}");
      if (iVar1 == 0) {
        uVar2 = 0x31;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"[");
      if (iVar1 == 0) {
        uVar2 = 0x32;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len != (wchar_t *)0x0) {
      iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                        (&local_1e8,0,1,L"]");
      if (iVar1 == 0) {
        uVar2 = 0x33;
        goto LAB_001708af;
      }
    }
    if ((wchar_t *)local_1e8._M_len == (wchar_t *)0x0) {
LAB_001708d8:
      std::__cxx11::ostringstream::ostringstream(local_198);
      local_1d8 = (wchar_t *)0x4;
      if (local_1e8._M_len < (wchar_t *)0x4) {
        local_1d8 = (wchar_t *)local_1e8._M_len;
      }
      local_1d0 = local_1e8._M_str;
      cpp_quote_abi_cxx11_(&local_1b8,(mjs *)&local_1d8,s_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Unhandled character(s) in ",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"get_punctuation",0xf)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,": ",2);
      local_1d8 = (wchar_t *)local_1c8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                ((string *)&local_1d8,local_1b8._M_dataplus._M_p,
                 local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(char *)local_1d8,(long)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_1d8 != (wchar_t *)local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this,(string *)&local_1d8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,1,L";");
    if (iVar1 != 0) goto LAB_001708d8;
    uVar2 = 0x34;
  }
  else {
    iVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                      (&local_1e8,0,1,L"=");
    if (iVar1 != 0) goto LAB_001703cc;
    uVar2 = 0x1d;
  }
LAB_001708af:
  uVar4 = 1;
LAB_001707f8:
  *(undefined4 *)_Var5 = uVar4;
  *(undefined4 *)((long)_Var5 + 4) = uVar2;
  return (tuple<mjs::token_type,_int>)_Var5;
}

Assistant:

std::tuple<token_type, int> get_punctuation(std::wstring_view s, version v) {
    assert(!s.empty());

#define CHECK_PUNCTUATORS(name, str, ver) if (v >= version::ver && s.length() >= sizeof(str)-1 && s.compare(0, sizeof(str)-1, L##str) == 0) return std::pair<token_type, int>{token_type::name, static_cast<int>(sizeof(str)-1)};
    MJS_PUNCTUATORS(CHECK_PUNCTUATORS)
#undef CHECK_PUNCTUATORS

        std::ostringstream oss;
    auto qs = cpp_quote(s.substr(0, s.length() < 4 ? s.length() : 4));
    oss << "Unhandled character(s) in " << __FUNCTION__ << ": " << std::string(qs.begin(), qs.end()) << "\n";
    throw std::runtime_error(oss.str());
}